

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  SVInt *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  pointer pSVar5;
  pointer pSVar6;
  byte *pbVar7;
  size_type sVar8;
  pointer pSVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar10;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar4 = this->cap;
  if (capacity < uVar4 * 2) {
    capacity = uVar4 * 2;
  }
  if (0x7fffffffffffffff - uVar4 < uVar4) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pSVar5 = (pointer)detail::allocArray(capacity,0x10);
  this_00 = (SVInt *)((long)pSVar5 + lVar11);
  SVInt::SVInt(this_00,&args->super_SVIntStorage);
  pSVar6 = this->data_;
  sVar8 = this->len;
  if (pSVar6 + sVar8 == pos) {
    pSVar9 = pSVar5;
    if (sVar8 != 0) {
      do {
        uVar3 = (pSVar6->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar6->super_SVIntStorage).signFlag;
        args = (SVInt *)CONCAT71((int7)((ulong)args >> 8),bVar1);
        bVar2 = (pSVar6->super_SVIntStorage).unknownFlag;
        (pSVar9->super_SVIntStorage).field_0.val = 0;
        (pSVar9->super_SVIntStorage).bitWidth = uVar3;
        (pSVar9->super_SVIntStorage).signFlag = bVar1;
        (pSVar9->super_SVIntStorage).unknownFlag = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pSVar6->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pSVar6->super_SVIntStorage).field_0;
          (pSVar6->super_SVIntStorage).field_0.val = 0;
        }
        (pSVar9->super_SVIntStorage).field_0 = aVar10;
        pSVar6 = pSVar6 + 1;
        pSVar9 = pSVar9 + 1;
      } while (pSVar6 != pos);
    }
  }
  else {
    pSVar9 = pSVar5;
    if (pSVar6 != pos) {
      do {
        uVar3 = (pSVar6->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar6->super_SVIntStorage).signFlag;
        args = (SVInt *)CONCAT71((int7)((ulong)args >> 8),bVar1);
        bVar2 = (pSVar6->super_SVIntStorage).unknownFlag;
        (pSVar9->super_SVIntStorage).field_0.val = 0;
        (pSVar9->super_SVIntStorage).bitWidth = uVar3;
        (pSVar9->super_SVIntStorage).signFlag = bVar1;
        (pSVar9->super_SVIntStorage).unknownFlag = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pSVar6->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pSVar6->super_SVIntStorage).field_0;
          (pSVar6->super_SVIntStorage).field_0.val = 0;
        }
        (pSVar9->super_SVIntStorage).field_0 = aVar10;
        pSVar6 = pSVar6 + 1;
        pSVar9 = pSVar9 + 1;
      } while (pSVar6 != pos);
      pSVar6 = this->data_;
      sVar8 = this->len;
    }
    if (pSVar6 + sVar8 != pos) {
      pbVar7 = (byte *)((long)pSVar5 + lVar11 + 0x1d);
      do {
        uVar3 = (pos->super_SVIntStorage).bitWidth;
        bVar1 = (pos->super_SVIntStorage).signFlag;
        args = (SVInt *)CONCAT71((int7)((ulong)args >> 8),bVar1);
        bVar2 = (pos->super_SVIntStorage).unknownFlag;
        pbVar7[-0xd] = 0;
        pbVar7[-0xc] = 0;
        pbVar7[-0xb] = 0;
        pbVar7[-10] = 0;
        pbVar7[-9] = 0;
        pbVar7[-8] = 0;
        pbVar7[-7] = 0;
        pbVar7[-6] = 0;
        *(uint *)(pbVar7 + -5) = uVar3;
        pbVar7[-1] = bVar1;
        *pbVar7 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pos->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pos->super_SVIntStorage).field_0;
          (pos->super_SVIntStorage).field_0.val = 0;
        }
        *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(pbVar7 + -0xd) = aVar10;
        pos = pos + 1;
        pbVar7 = pbVar7 + 0x10;
      } while (pos != pSVar6 + sVar8);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar5;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}